

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

bool __thiscall smf::MidiFile::readBase64(MidiFile *this,istream *instream)

{
  ssize_t sVar1;
  size_t __nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  MidiFile *this_00;
  string base64data;
  stringstream stream;
  string local_1d8;
  string local_1b8;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  this_00 = *(MidiFile **)(instream + *(long *)(*(long *)instream + -0x18) + 0xe8);
  __nbytes = 0;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_1b8,this_00,0xffffffff,0,0xffffffff);
  std::__cxx11::stringstream::stringstream(local_198);
  base64Decode(&local_1d8,this_00,&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  __buf = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
    __buf = extraout_RDX_00;
  }
  sVar1 = read(this,(int)local_198,__buf,__nbytes);
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  return (bool)(char)sVar1;
}

Assistant:

bool MidiFile::readBase64(std::istream& instream) {
	std::string base64data((std::istreambuf_iterator<char>(instream)),
			std::istreambuf_iterator<char>());
	std::stringstream stream;
	stream << MidiFile::base64Decode(base64data);
	return MidiFile::read(stream);
}